

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O2

void Cba_BlastShiftRight(Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,int fSticky,
                        Vec_Int_t *vRes)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  int local_70;
  
  piVar2 = Cba_VecCopy(vRes,pNum,nNum);
  uVar11 = 0;
  local_70 = 0;
  if (fSticky != 0) {
    local_70 = pNum[(long)nNum + -1];
  }
  uVar4 = 0x20;
  if (nShift < 0x20) {
    uVar4 = nShift;
  }
  uVar3 = (ulong)(uint)(nNum - fSticky);
  if (nNum - fSticky < 1) {
    uVar3 = uVar11;
  }
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar11;
  }
  for (uVar9 = 0; uVar9 != uVar5; uVar9 = uVar9 + 1) {
    iVar7 = 1 << ((byte)uVar9 & 0x1f);
    piVar6 = piVar2;
    lVar8 = (long)iVar7;
    uVar10 = uVar3;
    while (bVar12 = uVar10 != 0, uVar10 = uVar10 - 1, bVar12) {
      if (((int)uVar11 == 0) && (lVar8 < nNum)) {
        iVar1 = Gia_ManHashMux(pNew,pShift[uVar9],piVar6[iVar7],*piVar6);
        *piVar6 = iVar1;
        uVar11 = 0;
      }
      else {
        iVar1 = Gia_ManHashMux(pNew,pShift[uVar9],local_70,*piVar6);
        *piVar6 = iVar1;
        if (nNum < iVar7) {
          uVar11 = 1;
        }
      }
      piVar6 = piVar6 + 1;
      lVar8 = lVar8 + 1;
    }
  }
  return;
}

Assistant:

void Cba_BlastShiftRight( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, int fSticky, Vec_Int_t * vRes )
{
    int * pRes = Cba_VecCopy( vRes, pNum, nNum );
    int Fill = fSticky ? pNum[nNum-1] : 0;
    int i, j, fShort = 0;
    if ( nShift > 32 )
        nShift = 32;
    assert( nShift <= 32 );
    for( i = 0; i < nShift; i++ ) 
        for( j = 0; j < nNum - fSticky; j++ ) 
        {
            if( fShort || j + (1<<i) >= nNum ) 
            {
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], Fill, pRes[j] );
                if ( (1<<i) > nNum ) 
                    fShort = 1;
            } 
            else 
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], pRes[j+(1<<i)], pRes[j] );
        }
}